

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmodule.c
# Opt level: O1

FT_Error af_property_get_face_globals(FT_Face face,AF_FaceGlobals *aglobals,AF_Module module)

{
  int iVar1;
  AF_FaceGlobals globals;
  AF_FaceGlobals local_18;
  
  if (face != (FT_Face)0x0) {
    local_18 = (AF_FaceGlobals)(face->autohint).data;
    iVar1 = 0;
    if (local_18 == (AF_FaceGlobals)0x0) {
      iVar1 = af_face_globals_new(face,&local_18,module);
      if (iVar1 == 0) {
        (face->autohint).data = local_18;
        (face->autohint).finalizer = af_face_globals_free;
        iVar1 = 0;
      }
    }
    if (iVar1 == 0) {
      *aglobals = local_18;
    }
    return iVar1;
  }
  return 0x23;
}

Assistant:

static FT_Error
  af_property_get_face_globals( FT_Face          face,
                                AF_FaceGlobals*  aglobals,
                                AF_Module        module )
  {
    FT_Error        error = FT_Err_Ok;
    AF_FaceGlobals  globals;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    globals = (AF_FaceGlobals)face->autohint.data;
    if ( !globals )
    {
      /* trigger computation of the global style data */
      /* in case it hasn't been done yet              */
      error = af_face_globals_new( face, &globals, module );
      if ( !error )
      {
        face->autohint.data =
          (FT_Pointer)globals;
        face->autohint.finalizer =
          (FT_Generic_Finalizer)af_face_globals_free;
      }
    }

    if ( !error )
      *aglobals = globals;

    return error;
  }